

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O3

int Cloud_DagCollect(CloudManager *dd,CloudNode *n)

{
  uint in_EAX;
  int iVar1;
  CloudNode **ppCVar2;
  CloudManager *dd_00;
  CloudManager *n_00;
  int Counter;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  if (dd->ppNodes == (CloudNode **)0x0) {
    ppCVar2 = (CloudNode **)malloc((long)dd->nNodesLimit << 3);
    dd->ppNodes = ppCVar2;
  }
  dd_00 = (CloudManager *)((ulong)n & 0xfffffffffffffffe);
  n_00 = dd_00;
  iVar1 = Cloud_DagCollect_rec(dd,(CloudNode *)dd_00,(int *)((long)&uStack_28 + 4));
  cloudClearMark(dd_00,(CloudNode *)n_00);
  if (iVar1 == uStack_28._4_4_) {
    return iVar1;
  }
  __assert_fail("res == Counter",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                ,0x30b,"int Cloud_DagCollect(CloudManager *, CloudNode *)");
}

Assistant:

int Cloud_DagCollect( CloudManager * dd, CloudNode * n )
{
    int res, Counter = 0;
    if ( dd->ppNodes == NULL )
        dd->ppNodes = ABC_ALLOC( CloudNode *, dd->nNodesLimit );
    res = Cloud_DagCollect_rec( dd, Cloud_Regular( n ), &Counter );
    cloudClearMark( dd, Cloud_Regular( n ) );
    assert( res == Counter );
    return res;

}